

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathMLASTArithmeticExpression.cpp
# Opt level: O1

int __thiscall
MathML::AST::ArithmeticExpression::clone
          (ArithmeticExpression *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  int iVar1;
  INode *in_RAX;
  undefined8 *puVar2;
  pointer ppIVar3;
  undefined4 extraout_var;
  ulong uVar4;
  INode *local_38;
  
  local_38 = in_RAX;
  puVar2 = (undefined8 *)operator_new(0x28);
  *puVar2 = &PTR__ArithmeticExpression_009e2cb0;
  puVar2[1] = 0;
  puVar2[2] = 0;
  *(undefined8 *)((long)puVar2 + 0x14) = 0;
  *(undefined8 *)((long)puVar2 + 0x1c) = 0;
  *(Operator *)(puVar2 + 4) = this->mOperator;
  ppIVar3 = (this->mOperands).
            super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->mOperands).
      super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppIVar3) {
    uVar4 = 0;
    do {
      iVar1 = (*ppIVar3[uVar4]->_vptr_INode[4])(ppIVar3[uVar4],(ulong)__fn & 0xffffffff);
      local_38 = (INode *)CONCAT44(extraout_var,iVar1);
      std::vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>>::
      emplace_back<MathML::AST::INode*>
                ((vector<MathML::AST::INode*,std::allocator<MathML::AST::INode*>> *)(puVar2 + 1),
                 &local_38);
      uVar4 = uVar4 + 1;
      ppIVar3 = (this->mOperands).
                super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar4 < (ulong)((long)(this->mOperands).
                                   super__Vector_base<MathML::AST::INode_*,_std::allocator<MathML::AST::INode_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppIVar3 >> 3))
    ;
  }
  return (int)puVar2;
}

Assistant:

INode* ArithmeticExpression::clone(CloneFlags cloneFlags) const
        {
            ArithmeticExpression* copy = new ArithmeticExpression();
            copy->mOperator = mOperator;
            for (size_t i=0; i<mOperands.size(); ++i)
            {
                copy->mOperands.push_back( mOperands.at( i )->clone(cloneFlags) );
            }
            return copy;
        }